

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O0

Config * Config::load(string *file)

{
  bool bVar1;
  Config *in_RDI;
  runtime_error *e;
  ParseResult pr;
  Config *out;
  string *in_stack_00000218;
  Config *in_stack_00000f50;
  Value *in_stack_00000f58;
  Config *this;
  string local_38 [39];
  byte local_11;
  
  local_11 = 0;
  this = in_RDI;
  Config(in_RDI);
  toml::parseFile(in_stack_00000218);
  bVar1 = toml::ParseResult::valid((ParseResult *)0x229c90);
  if (bVar1) {
    anon_unknown.dwarf_2ae89::loadHandlers(in_stack_00000f58,in_stack_00000f50);
  }
  else {
    this->ok = false;
    std::__cxx11::string::operator=((string *)&this->error,local_38);
  }
  local_11 = 1;
  toml::ParseResult::~ParseResult((ParseResult *)this);
  if ((local_11 & 1) == 0) {
    ~Config(this);
  }
  return in_RDI;
}

Assistant:

Config Config::load(const std::string& file) {
  Config out;

  auto pr = toml::parseFile(file);
  if (!pr.valid()) {
    out.ok = false;
    out.error = pr.errorReason;
    return out;
  }

  try {
    loadHandlers(pr.value, out);
  } catch (std::runtime_error& e) {
    out.ok = false;
    out.error = e.what();
  }

  return out;
}